

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_samplers(Impl *this,MDNode *samplers,MDNode *refl)

{
  ResourceRemappingInterface *pRVar1;
  pointer pRVar2;
  ResourceVariableMeta RVar3;
  uint uVar4;
  MetadataKind MVar5;
  uint uVar6;
  uint space;
  uint value;
  uint uVar7;
  int iVar8;
  Id IVar9;
  Id IVar10;
  Builder *this_00;
  MDNode *resource;
  undefined4 extraout_var;
  ulong uVar11;
  LoggingCallback p_Var12;
  void *pvVar13;
  MDNode *reflections;
  _Alloc_hider name_00;
  ulong uVar14;
  ulong __new_size;
  uint index;
  bool bVar15;
  D3DBinding d3d_binding;
  DescriptorTableEntry local_table_entry;
  BindlessInfo bindless_info;
  String name;
  char buffer [4096];
  bool local_1117;
  uint local_10f8;
  uint local_10f4;
  undefined8 local_10f0;
  char local_10e8;
  undefined4 local_10e4;
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  *local_10e0;
  Vector<ResourceReference> *local_10d8;
  ulong local_10d0;
  ShaderStage local_10c4;
  undefined1 local_10c0;
  undefined4 local_10bc;
  uint local_10b8;
  uint local_10b4;
  uint local_10b0;
  undefined4 local_10ac;
  DescriptorTableEntry local_10a8;
  MDNode *local_1090;
  BindlessInfo local_1088;
  String local_1058;
  Capability local_1038 [3];
  undefined3 uStack_102b;
  undefined5 local_1028;
  undefined3 uStack_1023;
  undefined5 uStack_1020;
  undefined3 uStack_101b;
  undefined5 uStack_1018;
  undefined3 uStack_1013;
  undefined5 uStack_1010;
  undefined3 uStack_100b;
  undefined5 uStack_1008;
  
  local_1090 = refl;
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  uVar4 = LLVMBC::MDNode::getNumOperands(samplers);
  local_1117 = uVar4 == 0;
  if (!local_1117) {
    local_10e0 = (_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this_00->capabilities;
    local_10d8 = &this->sampler_index_to_reference;
    index = 0;
    do {
      resource = (MDNode *)LLVMBC::MDNode::getOperand(samplers,index);
      MVar5 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)resource);
      if (MVar5 != Node) {
        p_Var12 = get_thread_log_callback();
        if (p_Var12 == (LoggingCallback)0x0) {
          emit_samplers();
          std::terminate();
        }
        local_1028 = 0x6163206e69;
        uStack_1023 = 0x3c7473;
        uStack_1020 = 0xa2e3e54;
        local_1038._0_8_ = 0x2064696c61766e49;
        stack0xffffffffffffefd0 = 0x2065707974;
        uStack_102b = 0x204449;
        pvVar13 = get_thread_log_callback_userdata();
        (*p_Var12)(pvVar13,Error,(char *)local_1038);
        std::terminate();
      }
      RVar3 = get_resource_variable_meta(this,resource);
      reflections = (MDNode *)(ulong)(ushort)RVar3;
      bVar15 = false;
      if (0xff < (ushort)RVar3) {
        uVar6 = get_constant_metadata<unsigned_int>(resource,0);
        local_10d0 = CONCAT44(extraout_var,uVar6);
        get_resource_name_metadata_abi_cxx11_
                  (&local_1058,(dxil_spv *)resource,local_1090,reflections);
        space = get_constant_metadata<unsigned_int>(resource,3);
        uVar6 = get_constant_metadata<unsigned_int>(resource,4);
        value = get_constant_metadata<unsigned_int>(resource,5);
        if (value != 1) {
          if (value == 0xffffffff) {
            spv::Builder::addExtension(this_00,"SPV_EXT_descriptor_indexing");
            local_1038[0] = 0x14b6;
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>(local_10e0,local_1038);
          }
          local_1038[0] = 0x1d;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>(local_10e0,local_1038);
        }
        local_10a8.type = SRV;
        local_10a8.register_space = 0;
        local_10a8.register_index = 0;
        local_10a8.num_descriptors_in_range = 0;
        local_10a8.offset_in_heap = 0;
        uVar7 = get_local_root_signature_entry(this,Sampler,space,uVar6,&local_10a8);
        if ((int)uVar7 < 0) {
          bVar15 = true;
        }
        else {
          bVar15 = (this->local_root_signature).
                   super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7].type == Table;
        }
        local_10c4 = get_remapping_stage(this->execution_model);
        local_10c0 = 0xe;
        local_10bc = (undefined4)local_10d0;
        local_10ac = 0;
        local_10e4 = 0;
        local_10e8 = '\0';
        local_10f0 = 0;
        local_10f8 = space;
        local_10f4 = uVar6;
        local_10b8 = space;
        local_10b4 = uVar6;
        local_10b0 = value;
        if (((bVar15) &&
            (pRVar1 = this->resource_mapping_iface, pRVar1 != (ResourceRemappingInterface *)0x0)) &&
           (iVar8 = (*pRVar1->_vptr_ResourceRemappingInterface[3])(pRVar1,&local_10c4,&local_10f8),
           (char)iVar8 == '\0')) {
          p_Var12 = get_thread_log_callback();
          if (p_Var12 == (LoggingCallback)0x0) {
            emit_samplers();
          }
          else {
            snprintf((char *)local_1038,0x1000,"Failed to remap sampler %u:%u.\n",(ulong)space,
                     (ulong)uVar6);
            pvVar13 = get_thread_log_callback_userdata();
            (*p_Var12)(pvVar13,Error,(char *)local_1038);
          }
LAB_00118dac:
          bVar15 = true;
        }
        else {
          uVar14 = local_10d0;
          __new_size = (long)(this->sampler_index_to_reference).
                             super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->sampler_index_to_reference).
                             super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 6;
          uVar11 = (ulong)((int)local_10d0 + 1);
          if (__new_size <= uVar11) {
            __new_size = uVar11;
          }
          std::
          vector<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
          ::resize(local_10d8,__new_size);
          local_1088.descriptor_type = Identity;
          local_1088.uav_read = false;
          local_1088.uav_written = false;
          local_1088.uav_coherent = false;
          local_1088.counters = false;
          local_1088.type = Sampler;
          local_1088.component = Invalid;
          local_1088._2_2_ = 0;
          local_1088.raw_vecsize = V1;
          local_1088.kind = Sampler;
          local_1088._9_3_ = 0;
          local_1088.format = ImageFormatUnknown;
          local_1088._24_8_ = (ulong)local_10f8 << 0x20;
          local_1088.binding = local_10f4;
          if ((int)uVar7 < 0) {
            uVar14 = uVar14 & 0xffffffff;
            if (local_10e8 == '\0') {
              IVar9 = spv::Builder::makeSamplerType(this_00);
              if (value != 1) {
                if (value == 0xffffffff) {
                  IVar9 = spv::Builder::makeRuntimeArray(this_00,IVar9);
                }
                else {
                  IVar10 = spv::Builder::makeIntegerType(this_00,0x20,false);
                  IVar10 = spv::Builder::makeIntConstant(this_00,IVar10,value,false);
                  IVar9 = spv::Builder::makeArrayType(this_00,IVar9,IVar10,0);
                }
              }
              name_00._M_p = (pointer)local_1058._M_string_length;
              if ((char *)local_1058._M_string_length != (char *)0x0) {
                name_00._M_p = local_1058._M_dataplus._M_p;
              }
              IVar9 = SPIRVModule::create_variable
                                (this->spirv_module,StorageClassUniformConstant,IVar9,name_00._M_p);
              spv::Builder::addDecoration(this_00,IVar9,DecorationDescriptorSet,local_10f8);
              spv::Builder::addDecoration(this_00,IVar9,DecorationBinding,local_10f4);
              pRVar2 = (this->sampler_index_to_reference).
                       super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pRVar2[uVar14].var_id = IVar9;
            }
            else {
              IVar9 = create_bindless_heap_variable(this,&local_1088);
              if (((ushort)RVar3 & 1) != 0) {
                uVar6 = 0;
              }
              if (value == 1) {
                uVar6 = 0;
              }
              pRVar2 = (this->sampler_index_to_reference).
                       super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pRVar2[uVar14].var_id = IVar9;
              pRVar2[uVar14].push_constant_member = this->root_descriptor_count + (int)local_10f0;
              pRVar2[uVar14].base_offset = local_10f0._4_4_ - uVar6;
              pRVar2[uVar14].bindless = true;
            }
            pRVar2[uVar14].base_resource_is_array = value != 1;
            pRVar2[uVar14].resource_kind = Sampler;
LAB_00118ec6:
            bVar15 = false;
          }
          else {
            if (local_10e8 == '\0') {
              p_Var12 = get_thread_log_callback();
              if (p_Var12 == (LoggingCallback)0x0) {
                emit_samplers();
              }
              else {
                local_1028 = 0x73756d2073;
                uStack_1023 = 0x622074;
                uStack_1020 = 0x6e69622065;
                local_1038._0_8_ = 0x425320656c626154;
                stack0xffffffffffffefd0 = 0x746e652054;
                uStack_102b = 0x656972;
                uStack_101b = 0x656c64;
                uStack_1018 = 0xa2e7373;
                pvVar13 = get_thread_log_callback_userdata();
                (*p_Var12)(pvVar13,Error,(char *)local_1038);
              }
              goto LAB_00118dac;
            }
            IVar9 = create_bindless_heap_variable(this,&local_1088);
            if (((ushort)RVar3 & 1) == 0) {
              p_Var12 = get_thread_log_callback();
              if (p_Var12 == (LoggingCallback)0x0) {
                emit_samplers();
              }
              else {
                uStack_1018 = 0x206c61626f;
                uStack_1013 = 0x62696c;
                uStack_1010 = 0x6972617620;
                local_1028 = 0x2065727574;
                uStack_1023 = 0x716572;
                uStack_1020 = 0x7365726975;
                uStack_101b = 0x6c6720;
                local_1038._0_8_ = 0x6f72206c61636f4c;
                stack0xffffffffffffefd0 = 0x697320746f;
                uStack_102b = 0x616e67;
                uStack_100b = 0x6c6261;
                uStack_1008 = 0xa2e7365;
                pvVar13 = get_thread_log_callback_userdata();
                (*p_Var12)(pvVar13,Error,(char *)local_1038);
              }
            }
            else {
              uVar14 = uVar14 & 0xffffffff;
              pRVar2 = (local_10d8->
                       super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pRVar2[uVar14].var_id = IVar9;
              pRVar2[uVar14].base_offset =
                   (local_10a8.offset_in_heap + uVar6) - local_10a8.register_index;
              pRVar2[uVar14].bindless = true;
              pRVar2[uVar14].local_root_signature_entry = uVar7;
              pRVar2[uVar14].base_resource_is_array = value != 1;
              pRVar2[uVar14].resource_kind = Sampler;
            }
            bVar15 = true;
            if (((ushort)RVar3 & 1) != 0) goto LAB_00118ec6;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
             *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
          free_in_thread(local_1058._M_dataplus._M_p);
        }
      }
      if (bVar15) {
        return local_1117;
      }
      index = index + 1;
      local_1117 = uVar4 <= index;
    } while (index != uVar4);
  }
  return local_1117;
}

Assistant:

bool Converter::Impl::emit_samplers(const llvm::MDNode *samplers, const llvm::MDNode *refl)
{
	auto &builder = spirv_module.get_builder();
	unsigned num_samplers = samplers->getNumOperands();

	for (unsigned i = 0; i < num_samplers; i++)
	{
		auto *sampler = llvm::cast<llvm::MDNode>(samplers->getOperand(i));

		auto var_meta = get_resource_variable_meta(sampler);
		if (!var_meta.is_active)
			continue;

		unsigned index = get_constant_metadata(sampler, 0);
		auto name = get_resource_name_metadata(sampler, refl);
		unsigned bind_space = get_constant_metadata(sampler, 3);
		unsigned bind_register = get_constant_metadata(sampler, 4);
		unsigned range_size = get_constant_metadata(sampler, 5);

		if (range_size != 1)
		{
			if (range_size == ~0u)
			{
				builder.addExtension("SPV_EXT_descriptor_indexing");
				builder.addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);
			}

			// This capability also covers samplers.
			builder.addCapability(spv::CapabilitySampledImageArrayDynamicIndexing);
		}

		DescriptorTableEntry local_table_entry = {};
		int local_root_signature_entry = get_local_root_signature_entry(
			ResourceClass::Sampler, bind_space, bind_register, local_table_entry);
		bool need_resource_remapping = local_root_signature_entry < 0 ||
		                               local_root_signature[local_root_signature_entry].type == LocalRootSignatureType::Table;

		D3DBinding d3d_binding = { get_remapping_stage(execution_model),
			                       DXIL::ResourceKind::Sampler,
			                       index,
			                       bind_space,
			                       bind_register,
			                       range_size, 0 };
		VulkanBinding vulkan_binding = { bind_space, bind_register };
		if (need_resource_remapping && resource_mapping_iface && !resource_mapping_iface->remap_sampler(d3d_binding, vulkan_binding))
		{
			LOGE("Failed to remap sampler %u:%u.\n", bind_space, bind_register);
			return false;
		}

		sampler_index_to_reference.resize(std::max(sampler_index_to_reference.size(), size_t(index + 1)));

		BindlessInfo bindless_info = {};
		bindless_info.type = DXIL::ResourceType::Sampler;
		bindless_info.kind = DXIL::ResourceKind::Sampler;
		bindless_info.desc_set = vulkan_binding.descriptor_set;
		bindless_info.binding = vulkan_binding.binding;

		if (local_root_signature_entry >= 0)
		{
			// Samplers can only live in table entries.
			if (!vulkan_binding.bindless.use_heap)
			{
				LOGE("Table SBT entries must be bindless.\n");
				return false;
			}

			spv::Id var_id = create_bindless_heap_variable(bindless_info);

			uint32_t heap_offset = local_table_entry.offset_in_heap;
			heap_offset += bind_register - local_table_entry.register_index;

			if (!var_meta.is_lib_variable)
			{
				LOGE("Local root signature requires global lib variables.\n");
				return false;
			}

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.base_offset = heap_offset;
			ref.bindless = true;
			ref.local_root_signature_entry = local_root_signature_entry;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
		else if (vulkan_binding.bindless.use_heap)
		{
			spv::Id var_id = create_bindless_heap_variable(bindless_info);

			// DXIL already applies the t# register offset to any dynamic index, so counteract that here.
			// The exception is with lib_* where we access resources by variable, not through
			// createResource() >_____<.
			uint32_t heap_offset = vulkan_binding.bindless.heap_root_offset;
			if (range_size != 1 && !var_meta.is_lib_variable)
				heap_offset -= bind_register;

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.push_constant_member = vulkan_binding.root_constant_index + root_descriptor_count;
			ref.base_offset = heap_offset;
			ref.bindless = true;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
		else
		{
			spv::Id type_id = builder.makeSamplerType();

			if (range_size != 1)
			{
				if (range_size == ~0u)
					type_id = builder.makeRuntimeArray(type_id);
				else
					type_id = builder.makeArrayType(type_id, builder.makeUintConstant(range_size), 0);
			}

			spv::Id var_id = create_variable(spv::StorageClassUniformConstant, type_id, name.empty() ? nullptr : name.c_str());

			builder.addDecoration(var_id, spv::DecorationDescriptorSet, vulkan_binding.descriptor_set);
			builder.addDecoration(var_id, spv::DecorationBinding, vulkan_binding.binding);

			auto &ref = sampler_index_to_reference[index];
			ref.var_id = var_id;
			ref.base_resource_is_array = range_size != 1;
			ref.resource_kind = DXIL::ResourceKind::Sampler;
		}
	}

	return true;
}